

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Synth::renderFrame(V2Synth *this)

{
  size_t __n;
  float fVar1;
  float fVar2;
  uint32_t len;
  long lVar3;
  StereoSample *pSVar4;
  int ch;
  long lVar5;
  long lVar6;
  ulong uVar7;
  StereoSample *dest;
  ulong uVar8;
  V2Voice *this_00;
  float fVar9;
  
  len = (this->instance).SRcFrameSize;
  lVar6 = (long)(int)len;
  dest = (this->instance).mixbuf;
  __n = lVar6 * 8;
  uVar7 = 0;
  memset(dest,0,__n);
  memset((this->instance).aux1buf,0,lVar6 * 4);
  memset((this->instance).aux2buf,0,lVar6 * 4);
  memset((this->instance).auxabuf,0,__n);
  memset((this->instance).auxbbuf,0,__n);
  pSVar4 = (this->instance).chanbuf;
  do {
    uVar8 = 0;
    do {
      if (uVar7 == (uint)this->chanmap[uVar8]) goto LAB_00108cc1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x40);
    uVar8 = 0x40;
LAB_00108cc1:
    if ((uint)uVar8 != 0x40) {
      memset(pSVar4,0,__n);
      if ((uint)uVar8 < 0x40) {
        uVar8 = uVar8 & 0xffffffff;
        this_00 = this->voicesw + uVar8;
        do {
          if (uVar7 == (uint)this->chanmap[uVar8]) {
            V2Voice::render(this_00,pSVar4,len);
          }
          uVar8 = uVar8 + 1;
          this_00 = this_00 + 1;
        } while (uVar8 != 0x40);
      }
      if (uVar7 == 0xf) {
        ronanCBProcess((syWRonan *)&this->ronan,pSVar4->ch,len);
      }
      V2Chan::process(this->chansw + uVar7,len);
    }
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x10) {
      V2Reverb::render(&this->reverb,dest,len);
      V2ModDel::renderAux2Main(&this->delay,dest,len);
      V2DCFilter::renderStereo(&this->dcf,dest,dest,len);
      if (0 < (int)len) {
        fVar1 = this->lcfreq;
        fVar2 = this->hcfreq;
        lVar3 = 0;
        pSVar4 = dest;
        do {
          lVar5 = 0;
          do {
            fVar9 = pSVar4->ch[lVar5] - this->lcbuf[lVar5];
            this->lcbuf[lVar5] = fVar1 * fVar9 + this->lcbuf[lVar5];
            if ((fVar2 != 1.0) || (NAN(fVar2))) {
              fVar9 = (fVar9 - this->hcbuf[lVar5]) * fVar2 + this->hcbuf[lVar5];
              this->hcbuf[lVar5] = fVar9;
            }
            pSVar4->ch[lVar5] = fVar9;
            lVar5 = lVar5 + 1;
          } while (lVar5 == 1);
          lVar3 = lVar3 + 1;
          pSVar4 = pSVar4 + 1;
        } while (lVar3 != lVar6);
      }
      V2Comp::render(&this->compr,dest,len);
      return;
    }
  } while( true );
}

Assistant:

void renderFrame()
    {
        int nsamples = instance.SRcFrameSize;

        // clear output buffer
        memset(instance.mixbuf, 0, nsamples * sizeof(StereoSample));

        // clear aux buffers
        memset(instance.aux1buf, 0, nsamples * sizeof(float));
        memset(instance.aux2buf, 0, nsamples * sizeof(float));
        memset(instance.auxabuf, 0, nsamples * sizeof(StereoSample));
        memset(instance.auxbbuf, 0, nsamples * sizeof(StereoSample));

        // process all channels
        for (int chan = 0; chan < CHANS; chan++)
        {
            // check if any voices are active on this channel
            int voice = 0;
            while (voice < POLY && chanmap[voice] != chan)
                voice++;

            if (voice == POLY)
                continue;

            // clear channel buffer
            memset(instance.chanbuf, 0, nsamples * sizeof(StereoSample));

            // render all voices on this channel
            for (; voice < POLY; voice++)
            {
                if (chanmap[voice] != chan)
                    continue;

                voicesw[voice].render(instance.chanbuf, nsamples);
            }

            // channel 15 -> Ronan
            if (chan == CHANS - 1)
                ronanCBProcess(&ronan, &instance.chanbuf[0].l, nsamples);

            chansw[chan].process(nsamples);
        }

        // global filters
        StereoSample *mix = instance.mixbuf;
        reverb.render(mix, nsamples);
        delay.renderAux2Main(mix, nsamples);
        dcf.renderStereo(mix, mix, nsamples);

        // low cut/high cut
        float lcf = lcfreq, hcf = hcfreq;
        for (int i = 0; i < nsamples; i++)
        {
            for (int ch = 0; ch < 2; ch++)
            {
                // low cut
                float x = mix[i].ch[ch] - lcbuf[ch];
                lcbuf[ch] += lcf * x;

                // high cut
                if (hcf != 1.0f)
                {
                    hcbuf[ch] += hcf * (x - hcbuf[ch]);
                    x = hcbuf[ch];
                }

                mix[i].ch[ch] = x;
            }
        }

        // sum compressor
        compr.render(mix, nsamples);

        DEBUG_PLOT_STEREO(mix, mix, nsamples);
    }